

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_raw.c
# Opt level: O0

int archive_read_format_raw_read_data_skip(archive_read *a)

{
  long in_RDI;
  raw_info *info;
  int64_t in_stack_ffffffffffffffe8;
  archive_read *a_00;
  
  a_00 = (archive_read *)**(undefined8 **)(in_RDI + 0x948);
  if ((a_00->archive).vtable != (archive_vtable *)0x0) {
    __archive_read_consume(a_00,in_stack_ffffffffffffffe8);
    (a_00->archive).vtable = (archive_vtable *)0x0;
  }
  (a_00->archive).archive_format = 1;
  return 0;
}

Assistant:

static int
archive_read_format_raw_read_data_skip(struct archive_read *a)
{
	struct raw_info *info = (struct raw_info *)(a->format->data);

	/* Consume the bytes we read last time. */
	if (info->unconsumed) {
		__archive_read_consume(a, info->unconsumed);
		info->unconsumed = 0;
	}
	info->end_of_file = 1;
	return (ARCHIVE_OK);
}